

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

void coda_type_record_field_delete(coda_type_record_field *field)

{
  coda_type_record_field *field_local;
  
  if (field != (coda_type_record_field *)0x0) {
    if (field->name != (char *)0x0) {
      free(field->name);
    }
    if (field->real_name != (char *)0x0) {
      free(field->real_name);
    }
    if (field->type != (coda_type *)0x0) {
      coda_type_release(field->type);
    }
    if (field->available_expr != (coda_expression *)0x0) {
      coda_expression_delete(field->available_expr);
    }
    if (field->bit_offset_expr != (coda_expression *)0x0) {
      coda_expression_delete(field->bit_offset_expr);
    }
    free(field);
  }
  return;
}

Assistant:

void coda_type_record_field_delete(coda_type_record_field *field)
{
    if (field == NULL)
    {
        return;
    }
    if (field->name != NULL)
    {
        free(field->name);
    }
    if (field->real_name != NULL)
    {
        free(field->real_name);
    }
    if (field->type != NULL)
    {
        coda_type_release(field->type);
    }
    if (field->available_expr != NULL)
    {
        coda_expression_delete(field->available_expr);
    }
    if (field->bit_offset_expr != NULL)
    {
        coda_expression_delete(field->bit_offset_expr);
    }
    free(field);
}